

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall slang::SmallVector<int,_10UL>::SmallVector(SmallVector<int,_10UL> *this,Base *other)

{
  pointer __src;
  size_type sVar1;
  size_type newSize;
  int *__old_val;
  
  (this->super_SmallVectorBase<int>).data_ =
       (pointer)(this->super_SmallVectorBase<int>).firstElement;
  (this->super_SmallVectorBase<int>).len = 0;
  (this->super_SmallVectorBase<int>).cap = 0;
  __src = other->data_;
  if (__src == (pointer)other->firstElement) {
    (this->super_SmallVectorBase<int>).cap = 10;
    sVar1 = other->len;
    SmallVectorBase<int>::reserve(&this->super_SmallVectorBase<int>,sVar1);
    if (0 < (long)sVar1) {
      memmove((this->super_SmallVectorBase<int>).data_ + (this->super_SmallVectorBase<int>).len,
              __src,sVar1 * 4);
    }
    (this->super_SmallVectorBase<int>).len = sVar1;
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<int>).data_ = __src;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<int>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<int>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }